

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_SetInterleavedInputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  void *local_38;
  uchar *p;
  uint local_28;
  uint channel;
  uint i;
  uint channelCount_local;
  void *data_local;
  uint firstChannel_local;
  PaUtilBufferProcessor *bp_local;
  
  channel = channelCount;
  if (channelCount == 0) {
    channel = bp->inputChannelCount;
  }
  if (bp->inputChannelCount <= firstChannel) {
    __assert_fail("firstChannel < bp->inputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                  ,0x1e1,
                  "void PaUtil_SetInterleavedInputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (bp->inputChannelCount < firstChannel + channel) {
    __assert_fail("firstChannel + channelCount <= bp->inputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                  ,0x1e2,
                  "void PaUtil_SetInterleavedInputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (bp->hostInputIsInterleaved != 0) {
    local_38 = data;
    for (local_28 = 0; local_28 < channel; local_28 = local_28 + 1) {
      bp->hostInputChannels[0][firstChannel + local_28].data = local_38;
      local_38 = (void *)((long)local_38 + (ulong)bp->bytesPerHostInputSample);
      bp->hostInputChannels[0][firstChannel + local_28].stride = channel;
    }
    return;
  }
  __assert_fail("bp->hostInputIsInterleaved",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                ,0x1e3,
                "void PaUtil_SetInterleavedInputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
               );
}

Assistant:

void PaUtil_SetInterleavedInputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->inputChannelCount;

    assert( firstChannel < bp->inputChannelCount );
    assert( firstChannel + channelCount <= bp->inputChannelCount );
    assert( bp->hostInputIsInterleaved );

    for( i=0; i< channelCount; ++i )
    {
        bp->hostInputChannels[0][channel+i].data = p;
        p += bp->bytesPerHostInputSample;
        bp->hostInputChannels[0][channel+i].stride = channelCount;
    }
}